

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

interval_t __thiscall duckdb::Value::GetValueInternal<duckdb::interval_t>(Value *this)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  string *psVar3;
  NotImplementedException *this_00;
  InternalException *pIVar4;
  uint64_t in_RDX;
  undefined8 extraout_RDX;
  interval_t iVar5;
  hugeint_t input;
  string_t input_00;
  uhugeint_t input_01;
  LogicalType local_a0;
  Value local_88;
  string local_48;
  anon_union_16_2_67f50693_for_value local_28;
  
  if (this->is_null == true) {
    pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Calling GetValueInternal on a value that is NULL",
               (allocator *)&local_a0);
    InternalException::InternalException(pIVar4,(string *)&local_88);
    __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar1 = (this->type_).id_;
  switch(LVar1) {
  case BOOLEAN:
    iVar5 = Cast::Operation<bool,duckdb::interval_t>((this->value_).boolean);
    return iVar5;
  case TINYINT:
    iVar5 = Cast::Operation<signed_char,duckdb::interval_t>((this->value_).tinyint);
    return iVar5;
  case SMALLINT:
    iVar5 = Cast::Operation<short,duckdb::interval_t>((this->value_).smallint);
    return iVar5;
  case INTEGER:
    iVar5 = Cast::Operation<int,duckdb::interval_t>((this->value_).integer);
    return iVar5;
  case BIGINT:
    iVar5 = Cast::Operation<long,duckdb::interval_t>((this->value_).bigint);
    return iVar5;
  case DATE:
    iVar5 = Cast::Operation<duckdb::date_t,duckdb::interval_t>((date_t)(this->value_).date.days);
    return iVar5;
  case TIME:
    iVar5 = Cast::Operation<duckdb::dtime_t,duckdb::interval_t>((dtime_t)(this->value_).time.micros)
    ;
    return iVar5;
  case TIMESTAMP_SEC:
    iVar5 = Cast::Operation<duckdb::timestamp_sec_t,duckdb::interval_t>
                      ((timestamp_sec_t)(this->value_).timestamp_s.super_timestamp_t.value);
    return iVar5;
  case TIMESTAMP_MS:
    iVar5 = Cast::Operation<duckdb::timestamp_ms_t,duckdb::interval_t>
                      ((timestamp_ms_t)(this->value_).timestamp_ms.super_timestamp_t.value);
    return iVar5;
  case TIMESTAMP:
    iVar5 = Cast::Operation<duckdb::timestamp_t,duckdb::interval_t>
                      ((timestamp_t)(this->value_).timestamp.value);
    return iVar5;
  case TIMESTAMP_NS:
    iVar5 = Cast::Operation<duckdb::timestamp_ns_t,duckdb::interval_t>
                      ((timestamp_ns_t)(this->value_).timestamp_ns.super_timestamp_t.value);
    return iVar5;
  case DECIMAL:
    LogicalType::LogicalType(&local_a0,DOUBLE);
    DefaultCastAs(&local_88,this,&local_a0,false);
    iVar5 = GetValueInternal<duckdb::interval_t>(&local_88);
    ~Value(&local_88);
    LogicalType::~LogicalType(&local_a0);
    break;
  case FLOAT:
    iVar5 = Cast::Operation<float,duckdb::interval_t>((this->value_).float_);
    return iVar5;
  case DOUBLE:
    iVar5 = Cast::Operation<double,duckdb::interval_t>((this->value_).double_);
    return iVar5;
  case VARCHAR:
    psVar3 = StringValue::Get_abi_cxx11_(this);
    string_t::string_t((string_t *)&local_28.pointer,(psVar3->_M_dataplus)._M_p);
    input_00.value.pointer.ptr = (char *)extraout_RDX;
    input_00.value._0_8_ = local_28.pointer.ptr;
    iVar5 = Cast::Operation<duckdb::string_t,duckdb::interval_t>((Cast *)local_28._0_8_,input_00);
    break;
  case INTERVAL:
    iVar5.micros = in_RDX;
    iVar5._0_8_ = (this->value_).hugeint.upper;
    iVar5 = Cast::Operation<duckdb::interval_t,duckdb::interval_t>
                      ((Cast *)(this->value_).bigint,iVar5);
    return iVar5;
  case UTINYINT:
switchD_016fd3e3_caseD_1c:
    iVar5 = Cast::Operation<unsigned_char,duckdb::interval_t>((this->value_).utinyint);
    return iVar5;
  case USMALLINT:
switchD_016fd3e3_caseD_1d:
    iVar5 = Cast::Operation<unsigned_short,duckdb::interval_t>((this->value_).usmallint);
    return iVar5;
  case UINTEGER:
switchD_016fd3e3_caseD_1e:
    iVar5 = Cast::Operation<unsigned_int,duckdb::interval_t>((this->value_).uinteger);
    return iVar5;
  case UBIGINT:
    iVar5 = Cast::Operation<unsigned_long,duckdb::interval_t>((this->value_).ubigint);
    return iVar5;
  case TIMESTAMP_TZ:
    iVar5 = Cast::Operation<duckdb::timestamp_tz_t,duckdb::interval_t>
                      ((timestamp_tz_t)(this->value_).timestamp_tz.super_timestamp_t.value);
    return iVar5;
  case TIME_TZ:
    iVar5 = Cast::Operation<duckdb::dtime_tz_t,duckdb::interval_t>
                      ((dtime_tz_t)(this->value_).timetz.bits);
    return iVar5;
  case UHUGEINT:
    input_01.upper = in_RDX;
    input_01.lower = (this->value_).hugeint.upper;
    iVar5 = Cast::Operation<duckdb::uhugeint_t,duckdb::interval_t>
                      ((Cast *)(this->value_).bigint,input_01);
    return iVar5;
  case HUGEINT:
  case UUID:
    input.upper = in_RDX;
    input.lower = (this->value_).hugeint.upper;
    iVar5 = Cast::Operation<duckdb::hugeint_t,duckdb::interval_t>
                      ((Cast *)(this->value_).bigint,input);
    return iVar5;
  default:
    if (LVar1 == ENUM) {
      PVar2 = (this->type_).physical_type_;
      if (PVar2 == UINT32) goto switchD_016fd3e3_caseD_1e;
      if (PVar2 == UINT16) goto switchD_016fd3e3_caseD_1d;
      if (PVar2 != UINT8) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_88,"Invalid Internal Type for ENUMs",(allocator *)&local_a0);
        InternalException::InternalException(pIVar4,(string *)&local_88);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto switchD_016fd3e3_caseD_1c;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Unimplemented type \"%s\" for GetValue()",(allocator *)&local_a0
              );
    LogicalType::ToString_abi_cxx11_(&local_48,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,(string *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return iVar5;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}